

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O2

void __thiscall
booster::locale::ios_info::string_set::string_set(string_set *this,string_set *other)

{
  ulong __n;
  char *__dest;
  
  if (other->ptr != (char *)0x0) {
    __n = other->size;
    __dest = (char *)operator_new__(__n);
    this->ptr = __dest;
    this->size = __n;
    this->type = other->type;
    memcpy(__dest,other->ptr,__n);
    return;
  }
  this->type = (type_info *)0x0;
  this->size = 0;
  this->ptr = (char *)0x0;
  return;
}

Assistant:

ios_info::string_set::string_set(string_set const &other)
        {
            if(other.ptr!=0) {
                ptr=new char[other.size];
                size=other.size;
                type=other.type;
                memcpy(ptr,other.ptr,size);
            }
            else {
                ptr=0;
                size=0;
                type=0;
            }
        }